

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O2

void operations_test<viennamath::ct_constant<7l>,viennamath::ct_constant<7l>>
               (ct_constant<7L> *t,ct_constant<7L> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_constant<49L> local_36;
  ct_constant<49L> local_35;
  ct_constant<0L> local_34;
  ct_constant<0L> local_33;
  ct_constant<14L> local_32;
  ct_constant<14L> local_31;
  double local_30;
  double local_28;
  double local_20;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>
  local_14;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>
  local_12;
  
  local_30 = t2;
  local_28 = u2;
  poVar1 = std::operator<<((ostream *)&std::cout,"LHS: ");
  poVar1 = viennamath::operator<<(poVar1,t);
  poVar1 = std::operator<<(poVar1,", RHS: ");
  poVar1 = viennamath::operator<<(poVar1,u);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_20 = local_30 + local_28;
  evaluations_test<viennamath::ct_constant<14l>>(&local_31,local_20);
  evaluations_test<viennamath::ct_constant<14l>>(&local_32,local_20);
  evaluations_test<viennamath::ct_constant<0l>>(&local_33,local_30 - local_28);
  evaluations_test<viennamath::ct_constant<0l>>(&local_34,local_28 - local_30);
  local_20 = local_30 * local_28;
  evaluations_test<viennamath::ct_constant<49l>>(&local_35,local_20);
  evaluations_test<viennamath::ct_constant<49l>>(&local_36,local_20);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_div<double>,viennamath::ct_constant<7l>>>
            (&local_12,local_30 / local_28);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_div<double>,viennamath::ct_constant<7l>>>
            (&local_14,local_28 / local_30);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << ", RHS: " << u << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}